

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hpp
# Opt level: O2

bool ft::
     equal<ft::constTreeIterator<int,ft::allocator<ft::treeNode<int>>>,ft::constTreeIterator<int,ft::allocator<ft::treeNode<int>>>,ft::equal_to<int>>
               (treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *first1,long last1,
               treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *first2)

{
  treeNode<int> *ptVar1;
  
  while( true ) {
    ptVar1 = first1->m_node;
    if ((ptVar1 == *(treeNode<int> **)(last1 + 0x10)) || (ptVar1->value != first2->m_node->value))
    break;
    treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator++(first1);
    treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator++(first2);
  }
  return ptVar1 == *(treeNode<int> **)(last1 + 0x10);
}

Assistant:

bool equal(Iterator1 first1, Iterator1 last1, Iterator2 first2, BinaryPredicate pred,
		   typename ft::_void_t<typename ft::iterator_traits<Iterator1>::iterator_category>::type * = 0,
		   typename ft::_void_t<typename ft::iterator_traits<Iterator2>::iterator_category>::type * = 0) {
	while (first1 != last1) {
		if (!pred(*first1, *first2)) return false;
		++first1; ++first2;
	}
	return true;
}